

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O1

void google::protobuf::internal::OutputHelper<google::protobuf::internal::ArrayOutput,_5>::Serialize
               (void *ptr,ArrayOutput *output)

{
  uint uVar1;
  byte *pbVar2;
  bool bVar3;
  ulong uVar4;
  byte *pbVar5;
  ulong uVar6;
  ulong uVar7;
  
  pbVar2 = output->ptr;
  uVar1 = *ptr;
  *pbVar2 = (byte)uVar1;
  if ((ulong)(long)(int)uVar1 < 0x80) {
    pbVar5 = pbVar2 + 1;
  }
  else {
    *pbVar2 = (byte)uVar1 | 0x80;
    uVar4 = (ulong)(long)(int)uVar1 >> 7;
    pbVar2[1] = (byte)uVar4;
    pbVar5 = pbVar2 + 2;
    if (0x3fff < uVar1) {
      uVar7 = (ulong)pbVar2[1];
      do {
        pbVar5[-1] = (byte)uVar7 | 0x80;
        uVar6 = uVar4 >> 7;
        *pbVar5 = (byte)uVar6;
        pbVar5 = pbVar5 + 1;
        uVar7 = uVar6 & 0xffffffff;
        bVar3 = 0x3fff < uVar4;
        uVar4 = uVar6;
      } while (bVar3);
    }
  }
  output->ptr = pbVar5;
  return;
}

Assistant:

static void Serialize(const void* ptr, ArrayOutput* output) {
    output->ptr = PrimitiveTypeHelper<type>::SerializeToArray(ptr, output->ptr);
  }